

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

bool __thiscall llvm::yaml::Scanner::fetchMoreTokens(Scanner *this)

{
  byte *pbVar1;
  bool bVar2;
  size_type sVar3;
  byte *pbVar4;
  ulong uVar5;
  byte bVar6;
  StringRef Chars;
  StringRef FirstChar;
  Twine local_28;
  
  if (this->IsStartOfStream == true) {
    scanStreamStart(this);
    return true;
  }
  scanToNextToken(this);
  if (this->Current == this->End) {
    scanStreamEnd(this);
    return true;
  }
  removeStaleSimpleKeyCandidates(this);
  unrollIndent(this,this->Column);
  pbVar4 = (byte *)this->Current;
  bVar6 = *pbVar4;
  if (this->Column == 0) {
    if (bVar6 == 0x25) {
      bVar2 = scanDirective(this);
      return bVar2;
    }
    if (this->End < pbVar4 + 4) goto LAB_00172b5c;
    switch(bVar6) {
    case 0x21:
      goto switchD_00172c6e_caseD_21;
    case 0x22:
    case 0x23:
    case 0x24:
    case 0x25:
    case 0x27:
    case 0x28:
    case 0x29:
    case 0x2b:
      break;
    case 0x26:
      goto switchD_00172b6a_caseD_26;
    case 0x2a:
      goto switchD_00172b6a_caseD_2a;
    case 0x2c:
      goto switchD_00172b6a_caseD_2c;
    case 0x2d:
      if (((pbVar4[1] == 0x2d) && (pbVar4[2] == 0x2d)) &&
         (((ulong)pbVar4[3] < 0x21 && ((0x100002600U >> ((ulong)pbVar4[3] & 0x3f) & 1) != 0)))) {
        bVar2 = true;
LAB_00172d09:
        scanDocumentIndicator(this,bVar2);
        return true;
      }
      goto switchD_00172b6a_caseD_2d;
    case 0x2e:
      if ((((pbVar4[1] == 0x2e) && (pbVar4[2] == 0x2e)) && ((ulong)pbVar4[3] < 0x21)) &&
         ((0x100002600U >> ((ulong)pbVar4[3] & 0x3f) & 1) != 0)) {
        bVar2 = false;
        goto LAB_00172d09;
      }
      break;
    default:
      if (bVar6 == 0x3a) goto LAB_00172c28;
      if (bVar6 != 0x3f) {
        if (bVar6 == 0x5b) {
LAB_00172b2b:
          bVar2 = true;
          goto LAB_00172c0f;
        }
        if (bVar6 == 0x5d) goto LAB_00172bc2;
        if (bVar6 == 0x7b) goto LAB_00172c0a;
        if (bVar6 == 0x7c) goto LAB_00172c19;
        if (bVar6 != 0x7d) break;
LAB_00172bbb:
        bVar2 = false;
LAB_00172bc8:
        scanFlowCollectionEnd(this,bVar2);
        return true;
      }
LAB_00172bd2:
      if ((this->FlowLevel != 0) ||
         ((((byte *)this->End != pbVar4 + 1 && (uVar5 = (ulong)pbVar4[1], uVar5 < 0x21)) &&
          ((0x100002600U >> (uVar5 & 0x3f) & 1) != 0)))) {
        scanKey(this);
        return true;
      }
    }
  }
  else {
LAB_00172b5c:
    switch(bVar6) {
    case 0x26:
switchD_00172b6a_caseD_26:
      bVar2 = false;
LAB_00172c85:
      bVar2 = scanAliasOrAnchor(this,bVar2);
      return bVar2;
    case 0x27:
    case 0x28:
    case 0x29:
    case 0x2b:
      break;
    case 0x2a:
switchD_00172b6a_caseD_2a:
      bVar2 = true;
      goto LAB_00172c85;
    case 0x2c:
switchD_00172b6a_caseD_2c:
      scanFlowEntry(this);
      return true;
    case 0x2d:
switchD_00172b6a_caseD_2d:
      if ((((byte *)this->End != pbVar4 + 1) && (uVar5 = (ulong)pbVar4[1], uVar5 < 0x21)) &&
         ((0x100002600U >> (uVar5 & 0x3f) & 1) != 0)) {
        scanBlockEntry(this);
        return true;
      }
      break;
    default:
      if (bVar6 == 0x21) {
switchD_00172c6e_caseD_21:
        bVar2 = scanTag(this);
        return bVar2;
      }
      if (bVar6 == 0x3a) {
LAB_00172c28:
        if ((this->FlowLevel != 0) ||
           ((((byte *)this->End != pbVar4 + 1 && (uVar5 = (ulong)pbVar4[1], uVar5 < 0x21)) &&
            ((0x100002600U >> (uVar5 & 0x3f) & 1) != 0)))) {
          scanValue(this);
          return true;
        }
      }
      else {
        if (bVar6 == 0x3f) goto LAB_00172bd2;
        if (bVar6 == 0x7d) goto LAB_00172bbb;
        if (bVar6 == 0x5d) {
LAB_00172bc2:
          bVar2 = true;
          goto LAB_00172bc8;
        }
        if (bVar6 == 0x7b) {
LAB_00172c0a:
          bVar2 = false;
LAB_00172c0f:
          scanFlowCollectionStart(this,bVar2);
          return true;
        }
        if (bVar6 == 0x7c) {
LAB_00172c19:
          if (this->FlowLevel == 0) goto LAB_00172d1e;
        }
        else if (bVar6 == 0x5b) goto LAB_00172b2b;
      }
    }
  }
  if ((bVar6 == 0x3e) && (this->FlowLevel == 0)) {
LAB_00172d1e:
    bVar2 = scanBlockScalar(this,false);
    return bVar2;
  }
  if (bVar6 == 0x22) {
    bVar2 = true;
LAB_00172d46:
    bVar2 = scanFlowScalar(this,bVar2);
    return bVar2;
  }
  if (bVar6 == 0x27) {
    bVar2 = false;
    goto LAB_00172d46;
  }
  FirstChar.Length = 1;
  FirstChar.Data = (char *)pbVar4;
  if ((((byte *)this->End == pbVar4) || (0x20 < bVar6)) ||
     ((0x100002600U >> ((ulong)bVar6 & 0x3f) & 1) == 0)) {
    Chars.Length = 0x13;
    Chars.Data = "-?:,[]{}#&*!|>\'\"%@`";
    sVar3 = StringRef::find_first_of(&FirstChar,Chars,0);
    if (sVar3 == 0xffffffffffffffff) goto LAB_00172e07;
    pbVar4 = (byte *)this->Current;
    bVar6 = *pbVar4;
    if ((bVar6 == 0x2d) &&
       ((((byte *)this->End == pbVar4 + 1 || (uVar5 = (ulong)pbVar4[1], 0x20 < uVar5)) ||
        (bVar6 = 0x2d, (0x100002600U >> (uVar5 & 0x3f) & 1) == 0)))) goto LAB_00172e07;
  }
  if ((this->FlowLevel == 0) && ((bVar6 == 0x3f || (bVar6 == 0x3a)))) {
    pbVar1 = pbVar4 + 1;
    if ((((byte *)this->End != pbVar1) &&
        (((ulong)*pbVar1 < 0x21 && ((0x100002600U >> ((ulong)*pbVar1 & 0x3f) & 1) != 0)))) ||
       (((bVar6 == 0x3a && ((pbVar4 + 2 < this->End && (*pbVar1 == 0x3a)))) &&
        ((uVar5 = (ulong)pbVar4[2], 0x20 < uVar5 || ((0x100002600U >> (uVar5 & 0x3f) & 1) == 0))))))
    {
LAB_00172e07:
      bVar2 = scanPlainScalar(this);
      return bVar2;
    }
  }
  Twine::Twine(&local_28,"Unrecognized character while tokenizing.");
  setError(this,&local_28);
  return false;
}

Assistant:

bool Scanner::fetchMoreTokens() {
  if (IsStartOfStream)
    return scanStreamStart();

  scanToNextToken();

  if (Current == End)
    return scanStreamEnd();

  removeStaleSimpleKeyCandidates();

  unrollIndent(Column);

  if (Column == 0 && *Current == '%')
    return scanDirective();

  if (Column == 0 && Current + 4 <= End
      && *Current == '-'
      && *(Current + 1) == '-'
      && *(Current + 2) == '-'
      && (Current + 3 == End || isBlankOrBreak(Current + 3)))
    return scanDocumentIndicator(true);

  if (Column == 0 && Current + 4 <= End
      && *Current == '.'
      && *(Current + 1) == '.'
      && *(Current + 2) == '.'
      && (Current + 3 == End || isBlankOrBreak(Current + 3)))
    return scanDocumentIndicator(false);

  if (*Current == '[')
    return scanFlowCollectionStart(true);

  if (*Current == '{')
    return scanFlowCollectionStart(false);

  if (*Current == ']')
    return scanFlowCollectionEnd(true);

  if (*Current == '}')
    return scanFlowCollectionEnd(false);

  if (*Current == ',')
    return scanFlowEntry();

  if (*Current == '-' && isBlankOrBreak(Current + 1))
    return scanBlockEntry();

  if (*Current == '?' && (FlowLevel || isBlankOrBreak(Current + 1)))
    return scanKey();

  if (*Current == ':' && (FlowLevel || isBlankOrBreak(Current + 1)))
    return scanValue();

  if (*Current == '*')
    return scanAliasOrAnchor(true);

  if (*Current == '&')
    return scanAliasOrAnchor(false);

  if (*Current == '!')
    return scanTag();

  if (*Current == '|' && !FlowLevel)
    return scanBlockScalar(true);

  if (*Current == '>' && !FlowLevel)
    return scanBlockScalar(false);

  if (*Current == '\'')
    return scanFlowScalar(false);

  if (*Current == '"')
    return scanFlowScalar(true);

  // Get a plain scalar.
  StringRef FirstChar(Current, 1);
  if (!(isBlankOrBreak(Current)
        || FirstChar.find_first_of("-?:,[]{}#&*!|>'\"%@`") != StringRef::npos)
      || (*Current == '-' && !isBlankOrBreak(Current + 1))
      || (!FlowLevel && (*Current == '?' || *Current == ':')
          && isBlankOrBreak(Current + 1))
      || (!FlowLevel && *Current == ':'
                      && Current + 2 < End
                      && *(Current + 1) == ':'
                      && !isBlankOrBreak(Current + 2)))
    return scanPlainScalar();

  setError("Unrecognized character while tokenizing.");
  return false;
}